

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void unruh_G_x4_verify(picnic_instance_t *pp,proof_round_t *prf,sorting_helper_t *helper,uint vidx,
                      _Bool include_is)

{
  int iVar1;
  long in_RDI;
  byte in_R8B;
  uint outputlen;
  uint8_t tmp [4] [64];
  hash_context_x4 ctx;
  proof_round_t *prf3;
  proof_round_t *prf2;
  proof_round_t *prf1;
  proof_round_t *prf0;
  uint digest_size;
  undefined4 in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb6c;
  ushort uVar2;
  undefined2 in_stack_fffffffffffffb6e;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  size_t in_stack_fffffffffffffb88;
  uint8_t *in_stack_fffffffffffffb90;
  uint8_t *in_stack_fffffffffffffb98;
  uint8_t *in_stack_fffffffffffffba0;
  uint8_t *in_stack_fffffffffffffba8;
  hash_context_x4 *in_stack_fffffffffffffbb0;
  
  hash_init_prefix_x4((hash_context_x4 *)
                      CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                      CONCAT26(in_stack_fffffffffffffb6e,
                               CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)),'\0');
  hash_update_x4_4(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  hash_final_x4((hash_context_x4 *)0x1401dc);
  hash_squeeze_x4_4(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                    in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  hash_init_x4((hash_context_x4 *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               CONCAT26(in_stack_fffffffffffffb6e,
                        CONCAT24(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)));
  hash_update_x4_4(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  if ((in_R8B & 1) != 0) {
    hash_update_x4_4(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                     in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  }
  hash_update_x4_4(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                   in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  iVar1 = (uint)*(byte *)(in_RDI + 9) + (uint)*(byte *)(in_RDI + 8);
  if ((in_R8B & 1) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ushort)*(byte *)(in_RDI + 8);
  }
  hash_update_x4_uint16_le((hash_context_x4 *)CONCAT44(iVar1 + (uint)uVar2,iVar1),0);
  hash_final_x4((hash_context_x4 *)0x1403bf);
  hash_squeeze_x4_4(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,
                    in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  return;
}

Assistant:

static void unruh_G_x4_verify(const picnic_instance_t* pp, const proof_round_t* prf,
                              const sorting_helper_t* helper, unsigned int vidx, bool include_is) {
  const unsigned int digest_size = pp->digest_size;

  const proof_round_t* prf0 = &prf[helper[0]];
  const proof_round_t* prf1 = &prf[helper[1]];
  const proof_round_t* prf2 = &prf[helper[2]];
  const proof_round_t* prf3 = &prf[helper[3]];

  // Hash the seed with H_5, store digest in output
  hash_context_x4 ctx;
  hash_init_prefix_x4(&ctx, digest_size, HASH_PREFIX_5);
  hash_update_x4_4(&ctx, prf0->seeds[vidx], prf1->seeds[vidx], prf2->seeds[vidx], prf3->seeds[vidx],
                   pp->seed_size);
  hash_final_x4(&ctx);

  uint8_t tmp[4][MAX_DIGEST_SIZE];
  hash_squeeze_x4_4(&ctx, tmp[0], tmp[1], tmp[2], tmp[3], digest_size);
  hash_clear_x4(&ctx);

  // Hash H_5(seed), the view, and the length
  hash_init_x4(&ctx, digest_size);
  hash_update_x4_4(&ctx, tmp[0], tmp[1], tmp[2], tmp[3], digest_size);
  if (include_is) {
    hash_update_x4_4(&ctx, prf0->input_shares[vidx], prf1->input_shares[vidx],
                     prf2->input_shares[vidx], prf3->input_shares[vidx], pp->input_output_size);
  }
  hash_update_x4_4(&ctx, prf0->communicated_bits[vidx], prf1->communicated_bits[vidx],
                   prf2->communicated_bits[vidx], prf3->communicated_bits[vidx], pp->view_size);
  const unsigned int outputlen =
      pp->view_size + pp->input_output_size + (include_is ? pp->input_output_size : 0);
  hash_update_x4_uint16_le(&ctx, outputlen);
  hash_final_x4(&ctx);
  hash_squeeze_x4_4(&ctx, prf0->gs[vidx], prf1->gs[vidx], prf2->gs[vidx], prf3->gs[vidx],
                    outputlen);
  hash_clear_x4(&ctx);
}